

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::FunctionCase::logSingleOperationCalculationInfo
          (FunctionCase *this)

{
  ostringstream *this_00;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  local_190._0_8_ =
       ((this->super_OperatorPerformanceCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Note: program ",0xe);
  std::ostream::operator<<(this_00,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," contains ",10);
  std::ostream::operator<<(this_00,4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," calls to \'",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->m_func)._M_dataplus._M_p,(this->m_func)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\' in one loop iteration; ",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"cost of one operation is calculated as ",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"(cost_of_workload_with_calls - cost_of_workload_without_calls) / ",
             0x41);
  std::ostream::operator<<(this_00,4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void FunctionCase::logSingleOperationCalculationInfo (void) const
{
	const int numFunctionCalls = FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS;

	m_testCtx.getLog() << TestLog::Message << "Note: program " << (int)PROGRAM_WITH_FUNCTION_CALLS << " contains "
										   << numFunctionCalls << " calls to '" << m_func << "' in one loop iteration; "
										   << "cost of one operation is calculated as "
										   << "(cost_of_workload_with_calls - cost_of_workload_without_calls) / " << numFunctionCalls << TestLog::EndMessage;
}